

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

uchar * __thiscall
CVmRun::compute_sum_lcl_imm(CVmRun *this,vm_val_t *lclp,vm_val_t *ival,int lclidx,uchar *p)

{
  int iVar1;
  undefined4 in_ECX;
  vm_val_t *in_RDX;
  vm_val_t *in_RDI;
  vm_val_t *in_R8;
  uint in_stack_00000020;
  int in_stack_00000050;
  undefined4 in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  iVar1 = compute_sum((CVmRun *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_R8,in_RDI);
  local_8 = in_R8;
  if (iVar1 == 0) {
    CVmStack::push(in_RDX);
    local_8 = (vm_val_t *)
              op_overload(this,lclp._4_4_,(int)lclp,ival,lclidx._2_2_,in_stack_00000020,
                          in_stack_00000050);
  }
  return (uchar *)local_8;
}

Assistant:

const uchar *CVmRun::compute_sum_lcl_imm(VMG_ vm_val_t *lclp,
                                         const vm_val_t *ival,
                                         int lclidx, const uchar *p)
{
    /* compute the sum, leaving the result in the local */
    if (compute_sum(vmg_ lclp, ival))
    {
        /* success */
        return p;
    }
    else
    {
        /* check for an overload */
        push(ival);
        return op_overload(vmg_ p - entry_ptr_native_, lclidx,
                           lclp, G_predef->operator_add, 1,
                           VMERR_BAD_TYPE_ADD);
    }
}